

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O1

string * cmJoin<ContainerAlgorithms::Range<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
                   (string *__return_storage_ptr__,
                   Range<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *r,char *delimiter)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__value;
  ostringstream os;
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_1b0;
  undefined1 local_1a0 [376];
  
  if ((r->Begin).current._M_current == (r->End).current._M_current) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    __value = (r->Begin).current._M_current;
    pbVar1 = (r->End).current._M_current;
    lVar2 = (long)__value + (-0x20 - (long)pbVar1) >> 5;
    local_1b0._M_stream = (ostream_type *)local_1a0;
    local_1b0._M_string = delimiter;
    if (0 < lVar2) {
      lVar2 = lVar2 + 1;
      do {
        __value = __value + -1;
        std::
        ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
        ::operator=(&local_1b0,__value);
        lVar2 = lVar2 + -1;
      } while (1 < lVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& r, const char* delimiter)
{
  if (r.empty())
    {
    return std::string();
    }
  std::ostringstream os;
  typedef typename Range::value_type ValueType;
  typedef typename Range::const_iterator InputIt;
  const InputIt first = r.begin();
  InputIt last = r.end();
  --last;
  std::copy(first, last,
      std::ostream_iterator<ValueType>(os, delimiter));

  os << *last;

  return os.str();
}